

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::createMatrixConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  int iVar1;
  Instruction *pIVar2;
  pointer ppIVar3;
  Instruction *pIVar4;
  uint *puVar5;
  pointer __s2;
  Decoration DVar6;
  Id IVar7;
  uint uVar8;
  int iVar9;
  Id IVar10;
  Id IVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  pointer puVar15;
  pointer *ppuVar16;
  size_t __n;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  Id IVar21;
  pointer *__args;
  uint comp;
  bool bVar22;
  Id column;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matrixColumns;
  Id colv;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Id ids [4] [4];
  uint local_ec;
  uint local_e8;
  Decoration local_e4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  ulong local_b8;
  Id local_b0;
  Id local_ac;
  undefined8 local_a8;
  iterator iStack_a0;
  uint *local_98;
  Id local_90;
  Id local_8c;
  ulong local_88;
  ulong local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78 [3];
  
  IVar7 = getScalarTypeId(this,resultTypeId);
  uVar8 = getTypeNumColumns(this,resultTypeId);
  local_b8 = CONCAT44(local_b8._4_4_,uVar8);
  local_b0 = resultTypeId;
  local_e8 = getTypeNumRows(this,resultTypeId);
  pIVar2 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[IVar7];
  if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data & 1) != 0) {
    __assert_fail("!idOperand[op]",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                  ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
  }
  ppIVar3 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar4 = ppIVar3[*(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start];
  if (pIVar4 == (Instruction *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (ulong)pIVar4->typeId;
  }
  iVar1 = **(int **)&(pIVar2->operands).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data;
  local_e4 = precision;
  local_e0 = sources;
  if (ppIVar3[uVar19]->opCode == OpTypeMatrix) {
    if (pIVar4 == (Instruction *)0x0) {
      IVar10 = 0;
    }
    else {
      IVar10 = pIVar4->typeId;
    }
    uVar8 = getTypeNumColumns(this,IVar10);
    if ((uint)local_b8 <= uVar8) {
      pIVar2 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start
               [*(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start];
      if (pIVar2 == (Instruction *)0x0) {
        IVar10 = 0;
      }
      else {
        IVar10 = pIVar2->typeId;
      }
      uVar8 = getTypeNumRows(this,IVar10);
      if (local_e8 <= uVar8) {
        uVar8 = *(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        IVar7 = 0;
        IVar10 = getContainedTypeId(this,local_b0,0);
        local_e0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(local_e0._4_4_,IVar10);
        pIVar2 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar8];
        if (pIVar2 != (Instruction *)0x0) {
          IVar7 = pIVar2->typeId;
        }
        uVar12 = 0;
        IVar7 = getContainedTypeId(this,IVar7,0);
        local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)local_d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
        if (local_e8 != 0) {
          do {
            if (local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_78,
                         (iterator)
                         local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(uint *)&local_d8);
            }
            else {
              *local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar12;
              local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar12 = (int)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + 1;
            local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_d8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,uVar12);
          } while (uVar12 < local_e8);
        }
        DVar6 = local_e4;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (Id *)0x0;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        local_ec = 0;
        if ((uint)local_b8 != 0) {
          do {
            local_a8 = (void *)0x0;
            iStack_a0._M_current = (uint *)0x0;
            local_98 = (uint *)0x0;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,(iterator)0x0,
                       &local_ec);
            local_ac = createCompositeExtract
                                 (this,uVar8,IVar7,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
            if ((DVar6 != DecorationMax) && (local_ac != 0)) {
              addDecoration(this,local_ac,DVar6,-1);
            }
            pIVar2 = (this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar8];
            if (pIVar2 == (Instruction *)0x0) {
              IVar10 = 0;
            }
            else {
              IVar10 = pIVar2->typeId;
            }
            uVar12 = getTypeNumRows(this,IVar10);
            if (local_e8 == uVar12) {
              IVar10 = local_ac;
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                           (iterator)
                           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_ac);
              }
              else {
LAB_003dea51:
                *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = IVar10;
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              local_8c = createRvalueSwizzle(this,DVar6,(Id)local_e0,local_ac,local_78);
              IVar10 = local_8c;
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_003dea51;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_8c);
            }
            if (local_a8 != (void *)0x0) {
              operator_delete(local_a8,(long)local_98 - (long)local_a8);
            }
            local_ec = local_ec + 1;
          } while (local_ec < (uint)local_b8);
        }
        IVar7 = createCompositeConstruct(this,local_b0,&local_d8);
        if (IVar7 != 0 && DVar6 != DecorationMax) {
          addDecoration(this,IVar7,DVar6,-1);
        }
        puVar15 = local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar5 = local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
          puVar15 = local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar5 = local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        goto joined_r0x003df051;
      }
    }
  }
  puVar5 = (local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = local_b8 & 0xffffffff;
  if ((long)(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar5 >> 2 == local_80) {
    ppIVar3 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar2 = ppIVar3[*puVar5];
    if (pIVar2 == (Instruction *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)pIVar2->typeId;
    }
    if (ppIVar3[uVar19]->opCode == OpTypeVector) {
      if (pIVar2 == (Instruction *)0x0) {
        IVar10 = 0;
      }
      else {
        IVar10 = pIVar2->typeId;
      }
      uVar8 = getNumTypeConstituents(this,IVar10);
      if (uVar8 == local_e8) {
        __s2 = (local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
        puVar15 = __s2 + 1;
        __n = (long)(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar15;
        if ((__n == 0) || (iVar9 = bcmp(puVar15,__s2,__n), iVar9 == 0)) {
          IVar7 = createCompositeConstruct(this,local_b0,local_e0);
          if (IVar7 == 0 || local_e4 == DecorationMax) {
            return IVar7;
          }
          addDecoration(this,IVar7,local_e4,-1);
          return IVar7;
        }
      }
    }
  }
  if (iVar1 == 0x40) {
    IVar10 = makeDoubleConstant(this,1.0,false);
    IVar11 = makeDoubleConstant(this,0.0,false);
  }
  else {
    IVar10 = makeFloatConstant(this,1.0,false);
    IVar11 = makeFloatConstant(this,0.0,false);
  }
  ppuVar16 = (pointer *)local_78;
  lVar17 = 0;
  do {
    lVar20 = 0;
    do {
      IVar21 = IVar11;
      if (lVar17 == lVar20) {
        IVar21 = IVar10;
      }
      *(Id *)((long)ppuVar16 + lVar20 * 4) = IVar21;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar17 = lVar17 + 1;
    ppuVar16 = ppuVar16 + 2;
  } while (lVar17 != 4);
  puVar5 = (local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar5 == 4) {
    ppIVar3 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar2 = ppIVar3[*puVar5];
    if (pIVar2 == (Instruction *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)pIVar2->typeId;
    }
    if (2 < ppIVar3[uVar19]->opCode - OpTypeBool) goto LAB_003dec1e;
    lVar17 = 0;
    do {
      *(uint *)((long)&local_78[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar17) = *puVar5;
      lVar17 = lVar17 + 0x14;
    } while (lVar17 != 0x50);
  }
  else {
LAB_003dec1e:
    uVar8 = *puVar5;
    ppIVar3 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar2 = ppIVar3[uVar8];
    if (pIVar2 == (Instruction *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = (ulong)pIVar2->typeId;
    }
    if (ppIVar3[uVar19]->opCode == OpTypeMatrix) {
      IVar11 = 0;
      IVar10 = 0;
      if (pIVar2 != (Instruction *)0x0) {
        IVar10 = pIVar2->typeId;
      }
      uVar12 = getTypeNumColumns(this,IVar10);
      if ((uint)local_b8 <= uVar12) {
        uVar12 = (uint)local_b8;
      }
      local_e0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(local_e0._4_4_,uVar12);
      pIVar2 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      if (pIVar2 != (Instruction *)0x0) {
        IVar11 = pIVar2->typeId;
      }
      uVar12 = getTypeNumRows(this,IVar11);
      DVar6 = local_e4;
      if (local_e8 <= uVar12) {
        uVar12 = local_e8;
      }
      local_a8 = (void *)((ulong)local_a8._4_4_ << 0x20);
      if ((Id)local_e0 != 0) {
        do {
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,(iterator)0x0,
                     (uint *)&local_a8);
          local_ec = 0;
          if (uVar12 != 0) {
            do {
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                           (iterator)
                           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_ec);
              }
              else {
                *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_ec;
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              IVar10 = createCompositeExtract(this,uVar8,IVar7,&local_d8);
              *(Id *)((long)&local_78[0].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start +
                     (ulong)local_ec * 4 + ((ulong)local_a8 & 0xffffffff) * 0x10) = IVar10;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
              if ((DVar6 != DecorationMax) && (IVar10 != 0)) {
                addDecoration(this,IVar10,DVar6,-1);
              }
              local_ec = local_ec + 1;
            } while (local_ec < uVar12);
          }
          if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          uVar13 = (uint)local_a8 + 1;
          local_a8 = (void *)CONCAT44(local_a8._4_4_,uVar13);
        } while (uVar13 < (Id)local_e0);
      }
    }
    else {
      puVar15 = (local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_90 = IVar7;
      if ((uint)local_b8 != 0 &&
          (local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish != puVar15) {
        uVar19 = 0;
        uVar12 = 0;
        uVar8 = 0;
        do {
          IVar7 = puVar15[uVar19];
          uVar13 = 0;
          local_88 = uVar19;
          do {
            pIVar2 = (this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar19]];
            if (pIVar2 == (Instruction *)0x0) {
              IVar10 = 0;
            }
            else {
              IVar10 = pIVar2->typeId;
            }
            uVar14 = getNumTypeConstituents(this,IVar10);
            if (uVar14 <= uVar13) break;
            pIVar2 = (this->module).idToInstruction.
                     super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar19]];
            if (pIVar2 == (Instruction *)0x0) {
              IVar10 = 0;
            }
            else {
              IVar10 = pIVar2->typeId;
            }
            uVar14 = getNumTypeConstituents(this,IVar10);
            if (((1 < uVar14) &&
                (IVar7 = createCompositeExtract
                                   (this,(local_e0->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar19],local_90
                                    ,uVar13), local_e4 != DecorationMax)) && (IVar7 != 0)) {
              addDecoration(this,IVar7,local_e4,-1);
            }
            uVar18 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            *(Id *)((long)&local_78[0].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar18 * 4 + (ulong)uVar12 * 0x10) =
                 IVar7;
            bVar22 = uVar8 == local_e8;
            if (bVar22) {
              uVar8 = 0;
            }
            uVar12 = uVar12 + bVar22;
            uVar13 = uVar13 + 1;
          } while (uVar12 != (uint)local_b8);
          uVar19 = (ulong)((int)local_88 + 1);
          puVar15 = (local_e0->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while ((uVar19 < (ulong)((long)(local_e0->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar15
                                  >> 2)) && (uVar12 < (uint)local_b8));
      }
    }
  }
  IVar7 = getContainedTypeId(this,local_b0,0);
  local_e0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(local_e0._4_4_,IVar7);
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (Id *)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  if ((uint)local_b8 != 0) {
    local_b8 = (ulong)local_e8;
    ppuVar16 = (pointer *)local_78;
    uVar19 = 0;
    do {
      local_a8 = (void *)0x0;
      iStack_a0._M_current = (uint *)0x0;
      local_98 = (uint *)0x0;
      uVar18 = local_b8;
      __args = ppuVar16;
      if (local_e8 != 0) {
        do {
          if (iStack_a0._M_current == local_98) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a8,iStack_a0,
                       (uint *)__args);
          }
          else {
            *iStack_a0._M_current = *(uint *)__args;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          __args = (pointer *)((long)__args + 4);
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      bVar22 = local_e4 != DecorationMax;
      local_ec = createCompositeConstruct
                           (this,(Id)local_e0,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
      if (local_ec != 0 && bVar22) {
        addDecoration(this,local_ec,local_e4,-1);
      }
      if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_ec);
      }
      else {
        *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_ec;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      uVar19 = uVar19 + 1;
      ppuVar16 = ppuVar16 + 2;
    } while (uVar19 != local_80);
  }
  IVar7 = createCompositeConstruct(this,local_b0,&local_d8);
  puVar15 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar5 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (IVar7 != 0 && local_e4 != DecorationMax) {
    addDecoration(this,IVar7,local_e4,-1);
    puVar15 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar5 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
joined_r0x003df051:
  if (puVar15 != (pointer)0x0) {
    operator_delete(puVar15,(long)puVar5 - (long)puVar15);
  }
  return IVar7;
}

Assistant:

Id Builder::createMatrixConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id componentTypeId = getScalarTypeId(resultTypeId);
    unsigned int numCols = getTypeNumColumns(resultTypeId);
    unsigned int numRows = getTypeNumRows(resultTypeId);

    Instruction* instr = module.getInstruction(componentTypeId);
    const unsigned bitCount = instr->getImmediateOperand(0);

    // Optimize matrix constructed from a bigger matrix
    if (isMatrix(sources[0]) && getNumColumns(sources[0]) >= numCols && getNumRows(sources[0]) >= numRows) {
        // To truncate the matrix to a smaller number of rows/columns, we need to:
        // 1. For each column, extract the column and truncate it to the required size using shuffle
        // 2. Assemble the resulting matrix from all columns
        Id matrix = sources[0];
        Id columnTypeId = getContainedTypeId(resultTypeId);
        Id sourceColumnTypeId = getContainedTypeId(getTypeId(matrix));

        std::vector<unsigned> channels;
        for (unsigned int row = 0; row < numRows; ++row)
            channels.push_back(row);

        std::vector<Id> matrixColumns;
        for (unsigned int col = 0; col < numCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            Id colv = createCompositeExtract(matrix, sourceColumnTypeId, indexes);
            setPrecision(colv, precision);

            if (numRows != getNumRows(matrix)) {
                matrixColumns.push_back(createRvalueSwizzle(precision, columnTypeId, colv, channels));
            } else {
                matrixColumns.push_back(colv);
            }
        }

        return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
    }

    // Detect a matrix being constructed from a repeated vector of the correct size.
    // Create the composite directly from it.
    if (sources.size() == numCols && isVector(sources[0]) && getNumComponents(sources[0]) == numRows &&
        std::equal(sources.begin() + 1, sources.end(), sources.begin())) {
        return setPrecision(createCompositeConstruct(resultTypeId, sources), precision);
    }

    // Otherwise, will use a two step process
    // 1. make a compile-time 2D array of values
    // 2. construct a matrix from that array

    // Step 1.

    // initialize the array to the identity matrix
    Id ids[maxMatrixSize][maxMatrixSize];
    Id  one = (bitCount == 64 ? makeDoubleConstant(1.0) : makeFloatConstant(1.0));
    Id zero = (bitCount == 64 ? makeDoubleConstant(0.0) : makeFloatConstant(0.0));
    for (int col = 0; col < 4; ++col) {
        for (int row = 0; row < 4; ++row) {
            if (col == row)
                ids[col][row] = one;
            else
                ids[col][row] = zero;
        }
    }

    // modify components as dictated by the arguments
    if (sources.size() == 1 && isScalar(sources[0])) {
        // a single scalar; resets the diagonals
        for (int col = 0; col < 4; ++col)
            ids[col][col] = sources[0];
    } else if (isMatrix(sources[0])) {
        // constructing from another matrix; copy over the parts that exist in both the argument and constructee
        Id matrix = sources[0];
        unsigned int minCols = std::min(numCols, getNumColumns(matrix));
        unsigned int minRows = std::min(numRows, getNumRows(matrix));
        for (unsigned int col = 0; col < minCols; ++col) {
            std::vector<unsigned> indexes;
            indexes.push_back(col);
            for (unsigned int row = 0; row < minRows; ++row) {
                indexes.push_back(row);
                ids[col][row] = createCompositeExtract(matrix, componentTypeId, indexes);
                indexes.pop_back();
                setPrecision(ids[col][row], precision);
            }
        }
    } else {
        // fill in the matrix in column-major order with whatever argument components are available
        unsigned int row = 0;
        unsigned int col = 0;

        for (unsigned int arg = 0; arg < sources.size() && col < numCols; ++arg) {
            Id argComp = sources[arg];
            for (unsigned int comp = 0; comp < getNumComponents(sources[arg]); ++comp) {
                if (getNumComponents(sources[arg]) > 1) {
                    argComp = createCompositeExtract(sources[arg], componentTypeId, comp);
                    setPrecision(argComp, precision);
                }
                ids[col][row++] = argComp;
                if (row == numRows) {
                    row = 0;
                    col++;
                }
                if (col == numCols) {
                    // If more components are provided than fit the matrix, discard the rest.
                    break;
                }
            }
        }
    }

    // Step 2:  Construct a matrix from that array.
    // First make the column vectors, then make the matrix.

    // make the column vectors
    Id columnTypeId = getContainedTypeId(resultTypeId);
    std::vector<Id> matrixColumns;
    for (unsigned int col = 0; col < numCols; ++col) {
        std::vector<Id> vectorComponents;
        for (unsigned int row = 0; row < numRows; ++row)
            vectorComponents.push_back(ids[col][row]);
        Id column = createCompositeConstruct(columnTypeId, vectorComponents);
        setPrecision(column, precision);
        matrixColumns.push_back(column);
    }

    // make the matrix
    return setPrecision(createCompositeConstruct(resultTypeId, matrixColumns), precision);
}